

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O1

void __thiscall
o3dgc::Arithmetic_Codec::encode(Arithmetic_Codec *this,uint data,Static_Data_Model *M)

{
  uchar *puVar1;
  uchar uVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  uint uVar6;
  
  uVar4 = this->base;
  uVar6 = this->length >> 0xf;
  uVar3 = M->distribution[data];
  if (M->last_symbol == data) {
    this->base = uVar6 * uVar3 + uVar4;
    uVar6 = this->length - uVar6 * uVar3;
  }
  else {
    this->length = uVar6;
    this->base = uVar6 * uVar3 + uVar4;
    uVar6 = (M->distribution[data + 1] - uVar3) * uVar6;
  }
  this->length = uVar6;
  if (this->base < uVar4) {
    puVar5 = this->ac_pointer;
    while( true ) {
      puVar1 = puVar5 + -1;
      puVar5 = puVar5 + -1;
      if (*puVar1 != 0xff) break;
      *puVar5 = '\0';
    }
    *puVar5 = *puVar1 + '\x01';
  }
  uVar4 = this->length;
  while (uVar4 < 0x1000000) {
    uVar2 = *(uchar *)((long)&this->base + 3);
    puVar5 = this->ac_pointer;
    this->ac_pointer = puVar5 + 1;
    *puVar5 = uVar2;
    this->base = this->base << 8;
    uVar4 = this->length << 8;
    this->length = uVar4;
  }
  return;
}

Assistant:

void Arithmetic_Codec::encode(unsigned data,
                                  Static_Data_Model & M)
    {
    #ifdef _DEBUG
      if (mode != 1) AC_Error("encoder not initialized");
      if (data >= M.data_symbols) AC_Error("invalid data symbol");
    #endif

      unsigned x, init_base = base;
                                                               // compute products
      if (data == M.last_symbol) {
        x = M.distribution[data] * (length >> DM__LengthShift);
        base   += x;                                            // update interval
        length -= x;                                          // no product needed
      }
      else {
        x = M.distribution[data] * (length >>= DM__LengthShift);
        base   += x;                                            // update interval
        length  = M.distribution[data+1] * length - x;
      }
             
      if (init_base > base) propagate_carry();                 // overflow = carry

      if (length < AC__MinLength) renorm_enc_interval();        // renormalization
    }